

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall kj::anon_unknown_36::HttpClientImpl::watchForClose(HttpClientImpl *this)

{
  _func_int *p_Var1;
  SourceLocation location;
  SourceLocation location_00;
  OwnPromiseNode OVar2;
  void *pvVar3;
  SimpleTransformPromiseNode<bool,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:5705:15)>
  *location_01;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  HttpInputStream local_90;
  WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl> local_88;
  anon_class_8_1_8991fb9c_for_func local_78;
  PromiseBase local_70;
  code *local_68;
  OwnPromiseNode local_60;
  char *local_58;
  char *pcStack_50;
  HttpHeaderTable *local_48;
  StringPtr *local_40;
  undefined *puStack_38;
  ArrayDisposer *local_30;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  
  HttpInputStreamImpl::awaitNextMessage((HttpInputStreamImpl *)&stack0xffffffffffffff70);
  local_68 = kj::_::
             SimpleTransformPromiseNode<bool,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:5705:15)>
             ::anon_class_8_1_8991fb9c_for_func::operator();
  p_Var1 = local_90._vptr_HttpInputStream[1];
  local_78.this = this;
  if (p_Var1 == (_func_int *)0x0 ||
      (ulong)((long)local_90._vptr_HttpInputStream - (long)p_Var1) < 0x28) {
    pvVar3 = operator_new(0x400);
    location_01 = (SimpleTransformPromiseNode<bool,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:5705:15)>
                   *)((long)pvVar3 + 0x3d8);
    ctor<kj::_::SimpleTransformPromiseNode<bool,kj::(anonymous_namespace)::HttpClientImpl::watchForClose()::_lambda(bool)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::HttpClientImpl::watchForClose()::_lambda(bool)_1_,void*&>
              (location_01,
               (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xffffffffffffff70,
               &stack0xffffffffffffff88,&stack0xffffffffffffff98);
    *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
  }
  else {
    local_90._vptr_HttpInputStream[1] = (_func_int *)0x0;
    location_01 = (SimpleTransformPromiseNode<bool,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:5705:15)>
                   *)(local_90._vptr_HttpInputStream + -5);
    ctor<kj::_::SimpleTransformPromiseNode<bool,kj::(anonymous_namespace)::HttpClientImpl::watchForClose()::_lambda(bool)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::HttpClientImpl::watchForClose()::_lambda(bool)_1_,void*&>
              (location_01,
               (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xffffffffffffff70,
               &stack0xffffffffffffff88,&stack0xffffffffffffff98);
    local_90._vptr_HttpInputStream[-4] = p_Var1;
  }
  local_40 = (StringPtr *)&DAT_0042a172;
  puStack_38 = &DAT_0042a1d1;
  local_30 = (ArrayDisposer *)0x4c0000058b;
  location.function = &DAT_0042a1d1;
  location.fileName = &DAT_0042a172;
  location.lineNumber = 0x58b;
  location.columnNumber = 0x4c;
  local_70.node.ptr = (OwnPromiseNode)(OwnPromiseNode)location_01;
  kj::_::maybeChain<void>
            (&stack0xffffffffffffffa0,(Promise<void> *)&stack0xffffffffffffff90,location);
  OVar2.ptr = local_60.ptr;
  local_60.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&stack0xffffffffffffffa0);
  local_88.currentWrapper.ptr =
       (Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_&>)
       (Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_&>)OVar2.ptr;
  local_28.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&stack0xffffffffffffffd8);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&stack0xffffffffffffff90.node);
  local_58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  pcStack_50 = "watchForClose";
  local_48 = (HttpHeaderTable *)0x1800001648;
  location_00.function = "watchForClose";
  location_00.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location_00.lineNumber = 0x1648;
  location_00.columnNumber = 0x18;
  Promise<void>::eagerlyEvaluate
            ((Promise<void> *)&stack0xffffffffffffff80,&stack0xffffffffffffff78,location_00);
  kj::_::NullableValue<kj::Promise<void>>::emplace<kj::Promise<void>>
            ((NullableValue<kj::Promise<void>> *)&this->closeWatcherTask,
             (Promise<void> *)&stack0xffffffffffffff80);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xffffffffffffff80);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xffffffffffffff78);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xffffffffffffff70);
  return;
}

Assistant:

void watchForClose() {
    closeWatcherTask = httpInput.awaitNextMessage()
        .then([this](bool hasData) -> kj::Promise<void> {
      if (hasData) {
        // Uhh... The server sent some data before we asked for anything. Perhaps due to properties
        // of this application, the server somehow already knows what the next request will be, and
        // it is trying to optimize. Or maybe this is some sort of test and the server is just
        // replaying a script. In any case, we will humor it -- leave the data in the buffer and
        // let it become the response to the next request.
        return kj::READY_NOW;
      } else {
        // EOF -- server disconnected.
        closed = true;
        if (httpOutput.isInBody()) {
          // Huh, the application is still sending a request. We should let it finish. We do not
          // need to proactively free the socket in this case because we know that we're not
          // sitting in a reusable connection pool, because we know the application is still
          // actively using the connection.
          return kj::READY_NOW;
        } else {
          return httpOutput.flush().then([this]() {
            // We might be sitting in NetworkAddressHttpClient's `availableClients` pool. We don't
            // have a way to notify it to remove this client from the pool; instead, when it tries
            // to pull this client from the pool later, it will notice the client is dead and will
            // discard it then. But, we would like to avoid holding on to a socket forever. So,
            // destroy the socket now.
            // TODO(cleanup): Maybe we should arrange to proactively remove ourselves? Seems
            //   like the code will be awkward.
            ownStream = nullptr;
          });
        }
      }
    }).eagerlyEvaluate(nullptr);
  }